

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_decodingBufferSize_min
                 (unsigned_long_long windowSize,unsigned_long_long frameContentSize)

{
  unsigned_long_long uVar1;
  ulong uVar2;
  
  uVar1 = 0x20000;
  if (windowSize < 0x20000) {
    uVar1 = windowSize;
  }
  uVar2 = uVar1 + windowSize + 0x40;
  if (frameContentSize <= uVar2) {
    uVar2 = frameContentSize;
  }
  return uVar2;
}

Assistant:

size_t ZSTD_decodingBufferSize_min(unsigned long long windowSize, unsigned long long frameContentSize)
{
    size_t const blockSize = (size_t) MIN(windowSize, ZSTD_BLOCKSIZE_MAX);
    unsigned long long const neededRBSize = windowSize + blockSize + (WILDCOPY_OVERLENGTH * 2);
    unsigned long long const neededSize = MIN(frameContentSize, neededRBSize);
    size_t const minRBSize = (size_t) neededSize;
    RETURN_ERROR_IF((unsigned long long)minRBSize != neededSize,
                    frameParameter_windowTooLarge);
    return minRBSize;
}